

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  container_t *pcVar1;
  array_container_t *c;
  container_t *container_1;
  array_container_t *newac;
  container_t *container2;
  container_t *pcStack_38;
  uint8_t newtypecode;
  container_t *container;
  int32_t local_28;
  uint16_t uStack_22;
  uint8_t typecode;
  int i;
  uint16_t hb;
  roaring_array_t *ra;
  roaring_array_t *prStack_10;
  uint32_t val_local;
  roaring_bitmap_t *r_local;
  
  uStack_22 = (uint16_t)(val >> 0x10);
  _i = &r->high_low_container;
  ra._4_4_ = val;
  prStack_10 = &r->high_low_container;
  local_28 = ra_get_index(&r->high_low_container,uStack_22);
  if (local_28 < 0) {
    c = array_container_create();
    pcVar1 = container_add(c,(uint16_t)ra._4_4_,'\x02',(uint8_t *)((long)&container + 7));
    ra_insert_new_key_value_at(prStack_10,-1 - local_28,uStack_22,pcVar1,container._7_1_);
  }
  else {
    ra_unshare_container_at_index(_i,(uint16_t)local_28);
    pcStack_38 = ra_get_container_at_index(_i,(uint16_t)local_28,(uint8_t *)((long)&container + 7));
    container2._7_1_ = container._7_1_;
    pcVar1 = container_add(pcStack_38,(uint16_t)ra._4_4_,container._7_1_,
                           (uint8_t *)((long)&container2 + 7));
    if (pcVar1 != pcStack_38) {
      container_free(pcStack_38,container._7_1_);
      ra_set_container_at_index(prStack_10,local_28,pcVar1,container2._7_1_);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *container =
            ra_get_container_at_index(ra, i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}